

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

void __thiscall wasm::TranslateToFuzzReader::setupTags(TranslateToFuzzReader *this)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Tag_*,_false> _Var2;
  Module *pMVar3;
  uint32_t uVar4;
  unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_> *tag;
  pointer puVar5;
  IString *pIVar6;
  __uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true> _Var7;
  ulong uVar8;
  Name NVar9;
  IString IVar10;
  undefined1 auVar11 [16];
  HeapType local_50;
  HeapType local_48;
  IString *local_40;
  __single_object tag_1;
  __single_object tag_2;
  
  puVar1 = (this->wasm->tags).
           super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->wasm->tags).
                super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1) {
    _Var2._M_head_impl =
         (puVar5->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
         super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    if ((*(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) != (char *)0x0) &&
       (this->preserveImportsAndExports == false)) {
      *(undefined8 *)
       &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x28))->super_IString = 0;
      *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x30) = (char *)0x0;
      _Var2._M_head_impl =
           (puVar5->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
           super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
      *(undefined8 *)
       &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x18))->super_IString = 0;
      *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20) = (char *)0x0;
    }
  }
  uVar4 = Random::upTo(&this->random,3);
  if (uVar4 != 0) {
    uVar8 = (ulong)uVar4;
    do {
      addTag(this);
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  if ((this->preserveImportsAndExports == false) &&
     (uVar4 = Random::upTo(&this->random,2), uVar4 == 0)) {
    pMVar3 = this->wasm;
    NVar9.super_IString.str = (IString)wasm::IString::interned(7,"wasmtag",0);
    IVar10.str = (string_view)Names::getValidTagName(pMVar3,NVar9);
    wasm::HeapType::HeapType(&local_50,(Signature)ZEXT816(2));
    pIVar6 = (IString *)operator_new(0x40);
    pIVar6[1].str._M_len = 0;
    *(char **)((long)(pIVar6 + 1) + 8) = (char *)0x0;
    pIVar6[2].str._M_len = 0;
    *(char **)((long)(pIVar6 + 2) + 8) = (char *)0x0;
    pIVar6[3].str._M_len = 0;
    pIVar6->str = IVar10.str;
    *(uintptr_t *)((long)(pIVar6 + 3) + 8) = local_50.id;
    local_40 = pIVar6;
    auVar11 = wasm::IString::interned(0xf,"fuzzing-support",0);
    *(undefined1 (*) [16])((long)(pIVar6 + 1) + 8) = auVar11;
    auVar11 = wasm::IString::interned(7,"wasmtag",0);
    *(undefined1 (*) [16])((long)(pIVar6 + 2) + 8) = auVar11;
    wasm::Module::addTag((unique_ptr *)this->wasm);
    pMVar3 = this->wasm;
    NVar9.super_IString.str = (IString)wasm::IString::interned(5,"jstag",0);
    IVar10.str = (string_view)Names::getValidTagName(pMVar3,NVar9);
    wasm::HeapType::HeapType(&local_48,(Signature)ZEXT816(10));
    _Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
         (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)operator_new(0x40);
    (((IString *)
     ((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x20))->str)._M_len = 0;
    *(char **)((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x28) = (char *)0x0;
    (((IString *)
     ((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x10))->str)._M_len = 0;
    *(char **)((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18) = (char *)0x0;
    (((IString *)
     ((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x30))->str)._M_len = 0;
    *(string_view *)
     _Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
     super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
     super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl = IVar10.str;
    *(uintptr_t *)
     ((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x38) = local_48.id;
    tag_1._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
    super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
         (__uniq_ptr_data<wasm::Tag,_std::default_delete<wasm::Tag>,_true,_true>)
         _Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
         super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
    auVar11 = wasm::IString::interned(0xf,"fuzzing-support",0);
    *(undefined1 (*) [16])
     ((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x18) = auVar11;
    auVar11 = wasm::IString::interned(5,"jstag",0);
    *(undefined1 (*) [16])
     ((long)_Var7.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
            super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl + 0x28) = auVar11;
    wasm::Module::addTag((unique_ptr *)this->wasm);
    if ((__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)
        tag_1._M_t.super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
        super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>)0x0) {
      operator_delete((void *)tag_1._M_t.
                              super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t
                              .super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                              super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl,0x40);
    }
    if (local_40 != (IString *)0x0) {
      operator_delete(local_40,0x40);
    }
  }
  return;
}

Assistant:

void TranslateToFuzzReader::setupTags() {
  // As in modifyInitialFunctions(), we can't allow arbitrary tag imports, which
  // would trap when the fuzzing infrastructure doesn't know what to provide.
  for (auto& tag : wasm.tags) {
    if (tag->imported() && !preserveImportsAndExports) {
      tag->module = tag->base = Name();
    }
  }

  // Add some random tags.
  Index num = upTo(3);
  for (size_t i = 0; i < num; i++) {
    addTag();
  }

  // Add the fuzzing support tags manually sometimes.
  if (!preserveImportsAndExports && oneIn(2)) {
    auto wasmTag = builder.makeTag(Names::getValidTagName(wasm, "wasmtag"),
                                   Signature(Type::i32, Type::none));
    wasmTag->module = "fuzzing-support";
    wasmTag->base = "wasmtag";
    wasm.addTag(std::move(wasmTag));

    auto externref = Type(HeapType::ext, Nullable);
    auto jsTag = builder.makeTag(Names::getValidTagName(wasm, "jstag"),
                                 Signature(externref, Type::none));
    jsTag->module = "fuzzing-support";
    jsTag->base = "jstag";
    wasm.addTag(std::move(jsTag));
  }
}